

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<short>>
               (GetterXsYs<short> getter,TransformerLogLog transformer,ImDrawList *DrawList,
               ImPlotMarker marker,float size,bool rend_mk_line,ImU32 col_mk_line,float weight,
               bool rend_mk_fill,ImU32 col_mk_fill)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  short sVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ImVec2 c;
  ImVec2 local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pIVar7 = GImPlot;
  if (0 < getter.Count) {
    iVar10 = 0;
    do {
      pIVar8 = GImPlot;
      lVar9 = (long)(((getter.Offset + iVar10) % getter.Count + getter.Count) % getter.Count) *
              (long)getter.Stride;
      sVar3 = *(short *)((long)getter.Ys + lVar9);
      dVar5 = log10((double)(int)*(short *)((long)getter.Xs + lVar9) /
                    (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar4 = pIVar8->CurrentPlot;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar5;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_58 = pIVar8->LogDenX;
      uStack_50 = 0;
      dVar5 = (pIVar4->XAxis).Range.Min;
      local_48 = (pIVar4->XAxis).Range.Max;
      uStack_40 = 0;
      dVar6 = log10((double)(int)sVar3 / pIVar4->YAxis[transformer.YAxis].Range.Min);
      pIVar4 = pIVar8->CurrentPlot;
      auVar13._8_8_ = dVar6;
      auVar13._0_8_ = local_68._0_8_;
      auVar14._8_4_ = SUB84(pIVar8->LogDenY[transformer.YAxis],0);
      auVar14._0_8_ = local_58;
      auVar14._12_4_ = (int)((ulong)pIVar8->LogDenY[transformer.YAxis] >> 0x20);
      auVar14 = divpd(auVar13,auVar14);
      dVar6 = pIVar4->YAxis[transformer.YAxis].Range.Min;
      IVar1 = pIVar8->PixelRange[transformer.YAxis].Min;
      fVar11 = (float)(pIVar8->Mx *
                       (((double)(float)auVar14._0_8_ * (local_48 - dVar5) + dVar5) -
                       (pIVar4->XAxis).Range.Min) + (double)IVar1.x);
      fVar12 = (float)(pIVar8->My[transformer.YAxis] *
                       (((double)(float)auVar14._8_8_ *
                         (pIVar4->YAxis[transformer.YAxis].Range.Max - dVar6) + dVar6) - dVar6) +
                      (double)IVar1.y);
      local_70.y = fVar12;
      local_70.x = fVar11;
      pIVar4 = pIVar7->CurrentPlot;
      if (((((pIVar4->PlotRect).Min.x <= fVar11) &&
           (uVar2 = *(undefined8 *)&(pIVar4->PlotRect).Min.y, (float)uVar2 <= fVar12)) &&
          (fVar11 < (float)((ulong)uVar2 >> 0x20))) && (fVar12 < (pIVar4->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterXsYs<short>_>::marker_table[marker]
        )(DrawList,&local_70,size,rend_mk_line,col_mk_line,rend_mk_fill,col_mk_fill,weight);
      }
      iVar10 = iVar10 + 1;
    } while (getter.Count != iVar10);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}